

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

BSDF * __thiscall
pbrt::HairMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (BSDF *__return_storage_ptr__,HairMaterial *this,SampledWavelengths *param_3,
          float *param_4,undefined8 param_5,undefined8 param_6,undefined8 param_7,ulong param_8,
          undefined8 param_9,undefined8 param_10,undefined8 param_11,undefined8 param_12,
          undefined8 param_13,undefined8 param_14)

{
  ulong uVar1;
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  TextureEvalContext ctx_03;
  TextureEvalContext ctx_04;
  TextureEvalContext ctx_05;
  TextureEvalContext ctx_06;
  BSDF *pBVar2;
  uintptr_t iptr;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar13 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  undefined1 auVar20 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  SampledSpectrum SVar21;
  RGBUnboundedSpectrum RVar22;
  SampledSpectrum c;
  UniversalTextureEvaluator local_13d;
  Float local_13c;
  uint local_138;
  Float local_134;
  Float local_130;
  Float local_12c;
  SampledSpectrum local_128;
  BSDF *local_118;
  BxDFHandle local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  uintptr_t local_e8;
  uintptr_t local_e0;
  uintptr_t local_d8;
  uintptr_t local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  HairBxDF local_80;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  local_d0 = (this->beta_m).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx._8_8_ = param_8;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
  ctx._32_8_ = param_11;
  ctx._40_8_ = param_12;
  ctx._48_8_ = param_13;
  ctx._56_8_ = param_14;
  local_118 = __return_storage_ptr__;
  local_12c = UniversalTextureEvaluator::operator()(&local_13d,(FloatTextureHandle)&local_d0,ctx);
  local_d8 = (this->beta_n).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_00._8_8_ = param_8;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
  ctx_00._32_8_ = param_11;
  ctx_00._40_8_ = param_12;
  ctx_00._48_8_ = param_13;
  ctx_00._56_8_ = param_14;
  auVar5._0_4_ = UniversalTextureEvaluator::operator()
                           (&local_13d,(FloatTextureHandle)&local_d8,ctx_00);
  auVar5._4_60_ = extraout_var;
  auVar3 = vmaxss_avx(auVar5._0_16_,ZEXT416(0x3c23d70a));
  local_13c = auVar3._0_4_;
  local_e0 = (this->alpha).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_01._8_8_ = param_8;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
  ctx_01._32_8_ = param_11;
  ctx_01._40_8_ = param_12;
  ctx_01._48_8_ = param_13;
  ctx_01._56_8_ = param_14;
  local_130 = UniversalTextureEvaluator::operator()(&local_13d,(FloatTextureHandle)&local_e0,ctx_01)
  ;
  local_e8 = (this->eta).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_02._8_8_ = param_8;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
  ctx_02._32_8_ = param_11;
  ctx_02._40_8_ = param_12;
  ctx_02._48_8_ = param_13;
  ctx_02._56_8_ = param_14;
  local_134 = UniversalTextureEvaluator::operator()(&local_13d,(FloatTextureHandle)&local_e8,ctx_02)
  ;
  local_128.values.values = (array<float,_4>)ZEXT816(0);
  uVar1 = (this->sigma_a).
          super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  if ((uVar1 & 0xffffffffffff) != 0) {
    local_a8 = *(undefined8 *)(param_3->lambda).values;
    uStack_a0 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_98 = *(undefined8 *)(param_3->pdf).values;
    uStack_90 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(param_8);
    auVar20 = ZEXT856(0);
    ctx_03._8_8_ = param_8;
    ctx_03.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
    ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
    ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
    ctx_03._32_8_ = param_11;
    ctx_03._40_8_ = param_12;
    ctx_03._48_8_ = param_13;
    ctx_03._56_8_ = param_14;
    local_f0 = uVar1;
    SVar21 = UniversalTextureEvaluator::operator()
                       (&local_13d,(SpectrumTextureHandle)&local_f0,ctx_03,*param_3);
    auVar15._0_8_ = SVar21.values.values._8_8_;
    auVar15._8_56_ = auVar20;
    auVar6._0_8_ = SVar21.values.values._0_8_;
    auVar6._8_56_ = auVar13;
    auVar3 = vmovlhps_avx(auVar6._0_16_,auVar15._0_16_);
    local_128.values.values = (array<float,_4>)vmaxps_avx(auVar3,_DAT_00565010);
    goto LAB_004f5ef0;
  }
  uVar1 = (this->color).
          super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          .bits;
  if ((uVar1 & 0xffffffffffff) == 0) {
    uVar1 = (this->eumelanin).
            super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            .bits;
    if ((uVar1 & 0xffffffffffff) == 0) {
      if (((this->pheomelanin).
           super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
           .bits & 0xffffffffffff) == 0) {
        LogFatal<char_const(&)[25]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/materials.h"
                   ,0x1a4,"Check failed: %s",(char (*) [25])"eumelanin || pheomelanin");
      }
      if ((uVar1 & 0xffffffffffff) != 0) goto LAB_004f5e4f;
      auVar3._0_12_ = ZEXT812(0);
      auVar3._12_4_ = 0;
    }
    else {
LAB_004f5e4f:
      ctx_05._8_8_ = param_8;
      ctx_05.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
      ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
      ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
      ctx_05._32_8_ = param_11;
      ctx_05._40_8_ = param_12;
      ctx_05._48_8_ = param_13;
      ctx_05._56_8_ = param_14;
      local_100 = uVar1;
      auVar9._0_4_ = UniversalTextureEvaluator::operator()
                               (&local_13d,(FloatTextureHandle)&local_100,ctx_05);
      auVar9._4_60_ = extraout_var_00;
      auVar3 = auVar9._0_16_;
    }
    auVar14 = ZEXT816(0) << 0x40;
    auVar3 = vmaxss_avx(auVar3,auVar14);
    uVar1 = (this->pheomelanin).
            super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
            .bits;
    auVar4 = ZEXT816(0) << 0x40;
    if ((uVar1 & 0xffffffffffff) != 0) {
      local_138 = auVar3._0_4_;
      ctx_06._8_8_ = param_8;
      ctx_06.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
      ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
      ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
      ctx_06._32_8_ = param_11;
      ctx_06._40_8_ = param_12;
      ctx_06._48_8_ = param_13;
      ctx_06._56_8_ = param_14;
      local_108 = uVar1;
      auVar10._0_4_ =
           UniversalTextureEvaluator::operator()(&local_13d,(FloatTextureHandle)&local_108,ctx_06);
      auVar10._4_60_ = extraout_var_01;
      auVar4 = auVar10._0_16_;
      auVar14 = ZEXT816(0) << 0x40;
      auVar3 = ZEXT416(local_138);
    }
    auVar4 = vmaxss_avx(auVar4,auVar14);
    auVar20 = ZEXT856(auVar4._8_8_);
    auVar13 = ZEXT856(auVar3._8_8_);
    RVar22 = HairBxDF::SigmaAFromConcentration(auVar3._0_4_,auVar4._0_4_);
    auVar18._0_8_ = RVar22.rsp._4_8_;
    auVar18._8_56_ = auVar20;
    auVar11._0_8_ = RVar22._0_8_;
    auVar11._8_56_ = auVar13;
    local_80._0_16_ = vmovlhps_avx(auVar11._0_16_,auVar18._0_16_);
    auVar13 = ZEXT856(local_80._8_8_);
    SVar21 = RGBUnboundedSpectrum::Sample((RGBUnboundedSpectrum *)&local_80,param_3);
    auVar19._0_8_ = SVar21.values.values._8_8_;
    auVar19._8_56_ = auVar20;
    auVar4 = auVar19._0_16_;
    auVar12._0_8_ = SVar21.values.values._0_8_;
    auVar12._8_56_ = auVar13;
    auVar3 = auVar12._0_16_;
  }
  else {
    local_c8 = *(undefined8 *)(param_3->lambda).values;
    uStack_c0 = *(undefined8 *)((param_3->lambda).values + 2);
    uStack_b8 = *(undefined8 *)(param_3->pdf).values;
    uStack_b0 = *(undefined8 *)((param_3->pdf).values + 2);
    auVar13 = ZEXT856(param_8);
    auVar20 = ZEXT856(0);
    ctx_04._8_8_ = param_8;
    ctx_04.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
    ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
    ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
    ctx_04._32_8_ = param_11;
    ctx_04._40_8_ = param_12;
    ctx_04._48_8_ = param_13;
    ctx_04._56_8_ = param_14;
    local_f8 = uVar1;
    SVar21 = UniversalTextureEvaluator::operator()
                       (&local_13d,(SpectrumTextureHandle)&local_f8,ctx_04,*param_3);
    auVar16._0_8_ = SVar21.values.values._8_8_;
    auVar16._8_56_ = auVar20;
    auVar7._0_8_ = SVar21.values.values._0_8_;
    auVar7._8_56_ = auVar13;
    auVar3 = vmovlhps_avx(auVar7._0_16_,auVar16._0_16_);
    uVar1 = vcmpps_avx512vl(auVar3,ZEXT816(0) << 0x40,5);
    auVar4._8_4_ = 0x3f800000;
    auVar4._0_8_ = 0x3f8000003f800000;
    auVar4._12_4_ = 0x3f800000;
    auVar20 = ZEXT856(auVar4._8_8_);
    auVar3 = vminps_avx512vl(auVar4,auVar3);
    local_80.gamma_o = (Float)((uint)((byte)(uVar1 >> 1) & 1) * auVar3._4_4_);
    local_80.h = (Float)((uint)((byte)uVar1 & 1) * auVar3._0_4_);
    local_80.eta = (Float)((uint)((byte)(uVar1 >> 2) & 1) * auVar3._8_4_);
    local_80.sigma_a.values.values[0] = (float)((uint)((byte)(uVar1 >> 3) & 1) * auVar3._12_4_);
    auVar13 = (undefined1  [56])0x0;
    SVar21 = HairBxDF::SigmaAFromReflectance((SampledSpectrum *)&local_80,local_13c,param_3);
    auVar17._0_8_ = SVar21.values.values._8_8_;
    auVar17._8_56_ = auVar20;
    auVar4 = auVar17._0_16_;
    auVar8._0_8_ = SVar21.values.values._0_8_;
    auVar8._8_56_ = auVar13;
    auVar3 = auVar8._0_16_;
  }
  local_128.values.values = (array<float,_4>)vmovlhps_avx(auVar3,auVar4);
LAB_004f5ef0:
  auVar3 = vmaxss_avx(ZEXT416((uint)local_12c),ZEXT416(0x3c23d70a));
  auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)param_12),
                           ZEXT416(0xbf800000));
  HairBxDF::HairBxDF(&local_80,auVar4._0_4_,local_134,&local_128,auVar3._0_4_,local_13c,local_130);
  auVar3 = (undefined1  [16])local_80._0_16_;
  pBVar2 = local_118;
  *(undefined8 *)(param_4 + 4) = local_80.sigma_a.values.values._4_8_;
  param_4[6] = local_80.sigma_a.values.values[3];
  param_4[7] = local_80.beta_m;
  param_4[8] = local_80.beta_n;
  param_4[9] = local_80.v[0];
  *(undefined8 *)(param_4 + 10) = local_80.v._4_8_;
  param_4[0xc] = local_80.v[3];
  param_4[0xd] = local_80.s;
  *(undefined8 *)(param_4 + 0xe) = local_80.sin2kAlpha._0_8_;
  param_4[0x10] = local_80.sin2kAlpha[2];
  param_4[0x11] = local_80.cos2kAlpha[0];
  *(undefined8 *)(param_4 + 0x12) = local_80.cos2kAlpha._4_8_;
  param_4[0] = local_80.h;
  param_4[1] = local_80.gamma_o;
  param_4[2] = local_80.eta;
  param_4[3] = local_80.sigma_a.values.values[0];
  *(undefined8 *)(param_4 + 4) = local_80.sigma_a.values.values._4_8_;
  param_4[6] = local_80.sigma_a.values.values[3];
  param_4[7] = local_80.beta_m;
  param_4[8] = local_80.beta_n;
  param_4[9] = local_80.v[0];
  *(undefined8 *)(param_4 + 10) = local_80.v._4_8_;
  param_4[0xc] = local_80.v[3];
  param_4[0xd] = local_80.s;
  *(undefined8 *)(param_4 + 0xe) = local_80.sin2kAlpha._0_8_;
  local_110.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
           )((ulong)param_4 | 0x7000000000000);
  local_80._0_16_ = auVar3;
  BSDF::BSDF(local_118,(Vector3f *)&stack0x00000048,(Normal3f *)&stack0x00000054,
             (Normal3f *)&stack0x00000060,(Vector3f *)&stack0x0000006c,&local_110);
  return pBVar2;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda, HairBxDF *bxdf) const {
        Float bm = std::max<Float>(1e-2, texEval(beta_m, ctx));
        Float bn = std::max<Float>(1e-2, texEval(beta_n, ctx));
        Float a = texEval(alpha, ctx);
        Float e = texEval(eta, ctx);

        SampledSpectrum sig_a;
        if (sigma_a)
            sig_a = ClampZero(texEval(sigma_a, ctx, lambda));
        else if (color) {
            SampledSpectrum c = Clamp(texEval(color, ctx, lambda), 0, 1);
            sig_a = HairBxDF::SigmaAFromReflectance(c, bn, lambda);
        } else {
            CHECK(eumelanin || pheomelanin);
            sig_a = HairBxDF::SigmaAFromConcentration(
                        std::max(Float(0), eumelanin ? texEval(eumelanin, ctx) : 0),
                        std::max(Float(0), pheomelanin ? texEval(pheomelanin, ctx) : 0))
                        .Sample(lambda);
        }

        // Offset along width
        Float h = -1 + 2 * ctx.uv[1];
        *bxdf = HairBxDF(h, e, sig_a, bm, bn, a);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }